

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_59::InMemoryDirectory::ReplacerImpl<kj::Directory>::tryCommit
          (ReplacerImpl<kj::Directory> *this)

{
  bool bVar1;
  InMemoryDirectory *pIVar2;
  Impl *pIVar3;
  EntryImpl *this_00;
  Directory *__fn;
  WriteMode __flags;
  void *__child_stack;
  void *__arg;
  StringPtr name;
  Own<const_kj::Directory,_std::nullptr_t> local_88;
  EntryImpl *local_78;
  EntryImpl *entry;
  WriteMode local_68;
  undefined1 local_60 [16];
  EntryImpl *_entry1494;
  undefined1 local_48 [8];
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault local_28;
  Fault f;
  DebugExpression<bool> _kjCondition;
  ReplacerImpl<kj::Directory> *this_local;
  
  f.exception._6_1_ = ((this->super_Replacer<kj::Directory>).field_0xc ^ 0xff) & 1;
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (bVar1) {
    pIVar2 = Own<const_kj::(anonymous_namespace)::InMemoryDirectory,_std::nullptr_t>::operator->
                       (&this->directory);
    MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_48,
               &pIVar2->impl);
    pIVar3 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_48);
    StringPtr::StringPtr((StringPtr *)&entry,&this->name);
    __arg = (void *)(ulong)(this->super_Replacer<kj::Directory>).mode;
    name.content.size_ = (size_t)entry;
    name.content.ptr = (char *)pIVar3;
    __flags = local_68;
    InMemoryDirectory::Impl::openEntry((Impl *)local_60,name,local_68);
    this_00 = kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                        ((Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)
                         local_60);
    this_local._7_1_ = this_00 != (EntryImpl *)0x0;
    local_60._8_8_ = this_00;
    if (this_local._7_1_) {
      local_78 = this_00;
      __fn = Own<const_kj::Directory,_std::nullptr_t>::operator->(&this->inner);
      Directory::clone((Directory *)&local_88,(__fn *)__fn,__child_stack,__flags,__arg);
      EntryImpl::set(this_00,&local_88);
      Own<const_kj::Directory,_std::nullptr_t>::~Own(&local_88);
      pIVar3 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                         ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_48);
      InMemoryDirectory::Impl::modified(pIVar3);
    }
    Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_48);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[24]>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x5d3,FAILED,"!committed","_kjCondition,\"commit() already called\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [24])"commit() already called");
    this_local._7_1_ = true;
    kj::_::Debug::Fault::~Fault(&local_28);
  }
  return this_local._7_1_;
}

Assistant:

bool tryCommit() override {
      KJ_REQUIRE(!committed, "commit() already called") { return true; }

      auto lock = directory->impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(name, Replacer<T>::mode)) {
        entry.set(inner->clone());
        lock->modified();
        return true;
      } else {
        return false;
      }
    }